

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void send_wm_state_event(Window wnd,int add,Atom prop)

{
  Atom prop_local;
  int add_local;
  Window wnd_local;
  
  send_wm_event(wnd,fl_NET_WM_STATE,(long)(int)(uint)(add != 0),prop,0,0,0);
  return;
}

Assistant:

static void send_wm_state_event(Window wnd, int add, Atom prop) {
  send_wm_event(wnd, fl_NET_WM_STATE,
                add ? _NET_WM_STATE_ADD : _NET_WM_STATE_REMOVE, prop);
}